

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O3

void __thiscall
Scene::render_pass(Scene *this,RenderPass pass,Shadow shadow,bool light_projection,int display_w,
                  int display_h,ResourcePack *resource_pack,Camera *camera)

{
  GLuint GVar1;
  GLint GVar2;
  Mesh *pMVar3;
  anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3 *__return_storage_ptr__;
  string *name;
  uint uVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  string depthmap_shader;
  mat<4,_4,_float,_(glm::qualifier)0> Result_1;
  string box_mesh;
  string blue_shader;
  string shadowpcf_shader;
  string shadow_shader;
  mat4 mvp;
  anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3 *local_1c0;
  anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3 local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  undefined1 local_178 [16];
  string local_168;
  anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3 local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  undefined8 local_118;
  undefined8 uStack_110;
  string local_108;
  string local_e8;
  string local_c8;
  string local_a8;
  undefined8 local_88;
  undefined8 uStack_80;
  float local_70;
  float fStack_6c;
  float fStack_68;
  float fStack_64;
  float local_60;
  float fStack_5c;
  float fStack_58;
  float fStack_54;
  float local_50;
  float fStack_4c;
  float fStack_48;
  float fStack_44;
  float local_40;
  float fStack_3c;
  float fStack_38;
  float fStack_34;
  
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"shadow","");
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"shadowpcf","");
  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"blue","");
  local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"box","");
  local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"depthmap","");
  if (pass == GenerateDepthMap) {
    glViewport(0,0,this->shadow_width,this->shadow_height);
    (*__glewBindFramebuffer)(0x8d40,this->depth_map_framebuffer);
    glClear(0x100);
    glCullFace(0x404);
  }
  else if (pass == Display) {
    glViewport(0,0,display_w,display_h);
    glClear(0x4100);
  }
  __return_storage_ptr__ = &local_148;
  local_178._0_4_ = (float)display_w / (float)display_h;
  Camera::get_projection((mat4 *)__return_storage_ptr__,camera,(float)display_w / (float)display_h);
  local_1c0 = &local_1b8;
  Camera::get_view(camera);
  fVar6 = (float)local_118;
  fVar7 = (float)((ulong)local_118 >> 0x20);
  fVar5 = (float)uStack_110;
  fVar9 = (float)((ulong)uStack_110 >> 0x20);
  local_70 = fVar6 * fStack_1ac +
             local_128 * fStack_1b0 + local_138 * fStack_1b4 + local_148.x * local_1b8.x;
  fStack_6c = fVar7 * fStack_1ac +
              fStack_124 * fStack_1b0 + fStack_134 * fStack_1b4 + fStack_144 * local_1b8.x;
  fStack_68 = fStack_1ac * fVar5 +
              fStack_1b0 * fStack_120 + fStack_1b4 * fStack_130 + local_1b8.x * fStack_140;
  fStack_64 = fStack_1ac * fVar9 +
              fStack_1b0 * fStack_11c + fStack_1b4 * fStack_12c + local_1b8.x * fStack_13c;
  local_60 = fVar6 * fStack_19c +
             local_128 * fStack_1a0 + local_138 * fStack_1a4 + local_148.x * local_1a8;
  fStack_5c = fVar7 * fStack_19c +
              fStack_124 * fStack_1a0 + fStack_134 * fStack_1a4 + fStack_144 * local_1a8;
  fStack_58 = fStack_19c * fVar5 +
              fStack_1a0 * fStack_120 + fStack_1a4 * fStack_130 + local_1a8 * fStack_140;
  fStack_54 = fStack_19c * fVar9 +
              fStack_1a0 * fStack_11c + fStack_1a4 * fStack_12c + local_1a8 * fStack_13c;
  local_50 = fVar6 * fStack_18c +
             local_128 * fStack_190 + local_138 * fStack_194 + local_148.x * local_198;
  fStack_4c = fVar7 * fStack_18c +
              fStack_124 * fStack_190 + fStack_134 * fStack_194 + fStack_144 * local_198;
  fStack_48 = fStack_18c * fVar5 +
              fStack_190 * fStack_120 + fStack_194 * fStack_130 + local_198 * fStack_140;
  fStack_44 = fStack_18c * fVar9 +
              fStack_190 * fStack_11c + fStack_194 * fStack_12c + local_198 * fStack_13c;
  local_40 = fVar6 * fStack_17c +
             local_128 * fStack_180 + local_138 * fStack_184 + local_148.x * local_188;
  fStack_3c = fVar7 * fStack_17c +
              fStack_124 * fStack_180 + fStack_134 * fStack_184 + fStack_144 * local_188;
  fStack_38 = fStack_17c * fVar5 +
              fStack_180 * fStack_120 + fStack_184 * fStack_130 + local_188 * fStack_140;
  fStack_34 = fStack_17c * fVar9 +
              fStack_180 * fStack_11c + fStack_184 * fStack_12c + local_188 * fStack_13c;
  if (light_projection) {
    fVar9 = -0.33333334;
    fStack_17c = 1.0;
    fVar6 = -0.0;
    fVar7 = -0.0;
    fVar8 = -0.06666667;
    fVar10 = 0.0;
    fVar11 = 0.05;
    fVar5 = 0.05;
  }
  else {
    fVar6 = (float)local_178._0_4_ + -1.1920929e-07;
    uVar4 = -(uint)(-fVar6 <= fVar6);
    if ((float)(~uVar4 & (uint)-fVar6 | (uint)fVar6 & uVar4) <= 0.0) {
      __assert_fail("abs(aspect - std::numeric_limits<T>::epsilon()) > static_cast<T>(0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/glm/glm/gtc/../ext/matrix_clip_space.inl"
                    ,0xfb,"mat<4, 4, T, defaultp> glm::perspectiveRH_NO(T, T, T, T) [T = float]");
    }
    fVar5 = 1.0 / ((float)local_178._0_4_ * 0.003927011);
    fVar6 = 0.0;
    fVar7 = 0.0;
    fVar9 = 13.333333;
    fStack_17c = 0.0;
    fVar8 = -0.33333334;
    fVar10 = -1.0;
    fVar11 = 254.64659;
  }
  local_88 = CONCAT44(fStack_17c,fVar9);
  uStack_80 = 0;
  fStack_120 = (float)((uint)fVar9 & 0x80000000);
  local_148.x = fVar5 * -0.44721356 + 0.0 + fVar6;
  fStack_144 = fVar11 * 0.78071994 + -0.0 + fVar7;
  fStack_140 = (0.0 - fVar8 * 0.43643576) + fStack_120;
  fStack_13c = 0.0 - fVar10 * 0.43643576;
  local_178 = ZEXT416((uint)fStack_13c);
  local_138 = fVar5 * 0.0 + 0.0 + 0.0 + fVar6;
  fStack_134 = fVar11 * 0.48794997 + 0.0 + fVar7;
  fStack_130 = fVar8 * 0.8728715 + 0.0 + fStack_120;
  fStack_12c = fVar10 * 0.8728715 + 0.0;
  local_128 = fVar5 * 0.8944271 + 0.0 + fVar6;
  fStack_124 = fVar11 * 0.39035997 + 0.0 + fVar7;
  fStack_120 = (0.0 - fVar8 * 0.21821788) + fStack_120;
  fStack_11c = 0.0 - fVar10 * 0.21821788;
  fVar6 = (fVar5 * -0.0 - 0.0) + fVar6;
  fVar7 = fVar7 - fVar11 * 2.9802322e-08;
  fVar9 = fVar8 * -4.5825753 + fVar9;
  fStack_17c = fVar10 * -4.5825753 + fStack_17c;
  local_118 = CONCAT44(fVar7,fVar6);
  uStack_110 = CONCAT44(fStack_17c,fVar9);
  fVar5 = fStack_144 * 0.0 + local_148.x * 0.0;
  fStack_1b0 = fStack_13c * 0.5;
  fVar11 = fVar9 * 0.0;
  local_1b8.x = fStack_1b0 + fStack_140 * 0.0 + local_148.x * 0.5 + fStack_144 * 0.0;
  fStack_1b4 = fStack_1b0 + fStack_140 * 0.0 + fStack_144 * 0.5 + local_148.x * 0.0;
  fStack_1b0 = fStack_1b0 + fStack_140 * 0.5 + fVar5;
  fStack_1ac = fStack_13c + fStack_140 * 0.0 + fVar5;
  fVar5 = fStack_134 * 0.0 + local_138 * 0.0;
  fStack_1a0 = fStack_12c * 0.5;
  local_1a8 = fStack_1a0 + fStack_130 * 0.0 + local_138 * (float)DAT_002908b0 + fStack_134 * 0.0;
  fStack_1a4 = fStack_1a0 + fStack_130 * 0.0 + fStack_134 * DAT_002908b0._4_4_ + local_138 * 0.0;
  fStack_1a0 = fStack_1a0 + fStack_130 * 0.5 + fVar5;
  fStack_19c = fStack_12c + fStack_130 * 0.0 + fVar5;
  fVar5 = fStack_124 * 0.0 + local_128 * 0.0;
  fStack_190 = fStack_11c * 0.5;
  local_198 = fStack_190 + fStack_120 * 0.0 + local_128 * (float)DAT_002908b0 + fStack_124 * 0.0;
  fStack_194 = fStack_190 + fStack_120 * 0.0 + fStack_124 * DAT_002908b0._4_4_ + local_128 * 0.0;
  fStack_190 = fStack_190 + fStack_120 * 0.5 + fVar5;
  fStack_18c = fStack_11c + fStack_120 * 0.0 + fVar5;
  fStack_180 = fStack_17c * 0.5;
  fVar5 = fVar6 * 0.0 + fVar7 * 0.0;
  local_188 = fStack_180 + fVar11 + fVar6 * 0.5 + fVar7 * 0.0;
  fStack_184 = fStack_180 + fVar11 + fVar6 * 0.0 + fVar7 * 0.5;
  fStack_180 = fVar5 + fVar9 * 0.5 + fStack_180;
  fStack_17c = fVar5 + fVar11 + fStack_17c;
  (*__glewEnableVertexAttribArray)(0);
  (*__glewBindBuffer)(0x8892,this->grid_vertex_buffer);
  (*__glewVertexAttribPointer)(0,3,0x1406,'\0',0,(void *)0x0);
  if (pass == Display) {
    glBindTexture(0xde1,this->depth_map);
    name = &local_a8;
    if (shadow != ShadowMapping) {
      if (shadow != ShadowMappingPCF) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"UNIMPLEMENTED",0xd);
        std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
        exit(1);
      }
      name = &local_c8;
    }
    GVar1 = ResourcePack::get_program(resource_pack,name);
    (*__glewUseProgram)(GVar1);
    GVar2 = (*__glewGetUniformLocation)(GVar1,"mvp");
    (*__glewUniformMatrix4fv)(GVar2,1,'\0',&local_70);
    GVar2 = (*__glewGetUniformLocation)(GVar1,"depth_bias_mvp");
    __return_storage_ptr__ = &local_1b8;
LAB_001beb57:
    (*__glewUniformMatrix4fv)(GVar2,1,'\0',&__return_storage_ptr__->x);
  }
  else if (pass == GenerateDepthMap) {
    GVar1 = ResourcePack::get_program(resource_pack,&local_168);
    (*__glewUseProgram)(GVar1);
    GVar2 = (*__glewGetUniformLocation)(GVar1,"depth_mvp");
    goto LAB_001beb57;
  }
  (*__glewBindBuffer)(0x8893,this->grid_index_buffer);
  glDrawElements(4,(ulong)((long)(this->grid_indices).
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->grid_indices).
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start) >> 2,0x1405,0);
  (*__glewDisableVertexAttribArray)(0);
  (*__glewEnableVertexAttribArray)(0);
  (*__glewBindBuffer)(0x8892,this->object_vertex_buffer);
  (*__glewVertexAttribPointer)(0,3,0x1406,'\0',0,(void *)0x0);
  if (pass == Display) {
    (*__glewEnableVertexAttribArray)(1);
    (*__glewBindBuffer)(0x8892,this->object_normal_buffer);
    (*__glewVertexAttribPointer)(1,3,0x1406,'\0',0,(void *)0x0);
    glBindTexture(0xde1,this->depth_map);
    GVar1 = ResourcePack::get_program(resource_pack,&local_e8);
    (*__glewUseProgram)(GVar1);
    GVar2 = (*__glewGetUniformLocation)(GVar1,"mvp");
    (*__glewUniformMatrix4fv)(GVar2,1,'\0',&local_70);
    GVar2 = (*__glewGetUniformLocation)(GVar1,"depth_bias_mvp");
  }
  else {
    if (pass != GenerateDepthMap) goto LAB_001becd2;
    GVar1 = ResourcePack::get_program(resource_pack,&local_168);
    (*__glewUseProgram)(GVar1);
    GVar2 = (*__glewGetUniformLocation)(GVar1,"depth_mvp");
    local_1c0 = &local_148;
  }
  (*__glewUniformMatrix4fv)(GVar2,1,'\0',&local_1c0->x);
LAB_001becd2:
  pMVar3 = ResourcePack::get_mesh(resource_pack,&local_108);
  glDrawArrays(4,0,(ulong)((long)(pMVar3->vertices).
                                 super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                 super__Vector_impl_data._M_finish -
                          (long)(pMVar3->vertices).super__Vector_base<float,_std::allocator<float>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 2);
  (*__glewDisableVertexAttribArray)(0);
  if (pass == Display) {
    (*__glewDisableVertexAttribArray)(1);
  }
  else if (pass == GenerateDepthMap) {
    (*__glewBindFramebuffer)(0x8d40,0);
    glCullFace(0x405);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != &local_168.field_2) {
    operator_delete(local_168._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  return;
}

Assistant:

void Scene::render_pass(RenderPass pass, Shadow shadow, bool light_projection, int display_w, int display_h, ResourcePack& resource_pack, Camera& camera) {
    std::string shadow_shader("shadow");
    std::string shadowpcf_shader("shadowpcf");
    std::string blue_shader("blue");
    std::string box_mesh("box");
    std::string depthmap_shader("depthmap");
    GLuint uniform = -1;
    GLuint program_id = -1;

    switch (pass) {
        case RenderPass::GenerateDepthMap:
            glViewport(0, 0, shadow_width, shadow_height);
            glBindFramebuffer(GL_FRAMEBUFFER, depth_map_framebuffer);
            glClear(GL_DEPTH_BUFFER_BIT);
            glCullFace(GL_FRONT);
            break;
        case RenderPass::Display:
            glViewport(0, 0, display_w, display_h);
            glClear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT);
            break;
    }

    glm::mat4 mvp = camera.get_projection(static_cast<float>(display_w)/display_h) * camera.get_view();
    float near_plane = -10.0f, far_plane = 20.0f;
    glm::mat4 lightView = glm::lookAt(
        glm::vec3(-2.0f, 4.0f, -1.0f),
        glm::vec3(0.0f, 0.0f,  0.0f),
        glm::vec3(0.0f, 1.0f,  0.0f)
    );
    glm::mat4 lightProjection;
    if (light_projection) {
        lightProjection = glm::ortho(-20.0f, 20.0f, -20.0f, 20.0f, near_plane, far_plane);
    }
    else {
        lightProjection = glm::perspective(
            (float)glm::radians(0.45),
            static_cast<float>(display_w)/display_h,
            near_plane,
            far_plane
        );
    }
    glm::mat4 bias(
        0.5, 0.0, 0.0, 0.0,
        0.0, 0.5, 0.0, 0.0,
        0.0, 0.0, 0.5, 0.0,
        0.5, 0.5, 0.5, 1.0
    );
    glm::mat4 depth_mvp = lightProjection * lightView;
    glm::mat4 depth_bias_mvp = bias * depth_mvp;

    // Draw ground
    glEnableVertexAttribArray(0);
    glBindBuffer(GL_ARRAY_BUFFER, grid_vertex_buffer);
    glVertexAttribPointer(
        0,
        3,
        GL_FLOAT,
        GL_FALSE,
        0,
        (void*)0
    );

    if (pass == RenderPass::Display) {
        glBindTexture(GL_TEXTURE_2D, depth_map);
    }

    switch (pass) {
        case RenderPass::GenerateDepthMap:
            program_id = resource_pack.get_program(depthmap_shader);
            glUseProgram(program_id);
            uniform = glGetUniformLocation(program_id, "depth_mvp");
            glUniformMatrix4fv(uniform, 1, GL_FALSE, &depth_mvp[0][0]);
            break;
        case RenderPass::Display:
            switch (shadow) {
                case Shadow::ShadowMapping:
                    program_id = resource_pack.get_program(shadow_shader);
                    break;
                case Shadow::ShadowMappingPCF:
                    program_id = resource_pack.get_program(shadowpcf_shader);
                    break;
                default:
                    std::cout << "UNIMPLEMENTED" << std::endl;
                    exit(1);
            }
            glUseProgram(program_id);
            uniform = glGetUniformLocation(program_id, "mvp");
            glUniformMatrix4fv(uniform, 1, GL_FALSE, &mvp[0][0]);
            uniform = glGetUniformLocation(program_id, "depth_bias_mvp");
            glUniformMatrix4fv(uniform, 1, GL_FALSE, &depth_bias_mvp[0][0]);
            break;
    }

    glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, grid_index_buffer);
    glDrawElements(GL_TRIANGLES, grid_indices.size(), GL_UNSIGNED_INT, 0);

    glDisableVertexAttribArray(0);

    // Draw object
    glEnableVertexAttribArray(0);
    glBindBuffer(GL_ARRAY_BUFFER, object_vertex_buffer);
    glVertexAttribPointer(
        0,
        3,
        GL_FLOAT,
        GL_FALSE,
        0,
        (void*)0
    );

    if (pass == RenderPass::Display) {
        glEnableVertexAttribArray(1);
        glBindBuffer(GL_ARRAY_BUFFER, object_normal_buffer);
        glVertexAttribPointer(
            1,
            3,
            GL_FLOAT,
            GL_FALSE,
            0,
            (void*)0
        );
    }

    if (pass == RenderPass::Display) {
        glBindTexture(GL_TEXTURE_2D, depth_map);
    }

    switch (pass) {
        case RenderPass::GenerateDepthMap:
            program_id = resource_pack.get_program(depthmap_shader);
            glUseProgram(program_id);
            uniform = glGetUniformLocation(program_id, "depth_mvp");
            glUniformMatrix4fv(uniform, 1, GL_FALSE, &depth_mvp[0][0]);
            break;
        case RenderPass::Display:
            program_id = resource_pack.get_program(blue_shader);
            glUseProgram(program_id);
            uniform = glGetUniformLocation(program_id, "mvp");
            glUniformMatrix4fv(uniform, 1, GL_FALSE, &mvp[0][0]);
            uniform = glGetUniformLocation(program_id, "depth_bias_mvp");
            glUniformMatrix4fv(uniform, 1, GL_FALSE, &depth_bias_mvp[0][0]);
            break;
    }

    glDrawArrays(GL_TRIANGLES, 0, resource_pack.get_mesh(box_mesh)->vertices.size());

    glDisableVertexAttribArray(0);

    if (pass == RenderPass::Display) {
        glDisableVertexAttribArray(1);
    }

    switch (pass) {
        case RenderPass::GenerateDepthMap:
            glBindFramebuffer(GL_FRAMEBUFFER, 0);
            glCullFace(GL_BACK);
            break;
        case RenderPass::Display:
            break;
    }
}